

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

shared_ptr<pbrt::syntactic::Texture> __thiscall
pbrt::syntactic::Attributes::findNamedItem<std::shared_ptr<pbrt::syntactic::Texture>>
          (Attributes *this,shared_ptr<pbrt::syntactic::Texture> *item,string *name)

{
  element_type *item_00;
  iterator iVar1;
  key_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<pbrt::syntactic::Texture> sVar3;
  undefined1 auStack_68 [48];
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  local_38 = 0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Texture>_>_>_>
                  *)(item + 0xe),in_RCX);
  if (iVar1._M_node ==
      (_Base_ptr)
      &item[0xe].super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount) {
    item_00 = item[7].super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (item_00 == (element_type *)0x0) {
      (this->lastClone).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (this->lastClone).super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var2._M_pi = extraout_RDX;
    }
    else {
      std::__shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2> *)auStack_68,
                 (__shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2> *)name);
      std::__cxx11::string::string((string *)(auStack_68 + 0x10),(string *)in_RCX);
      findNamedItem<std::shared_ptr<pbrt::syntactic::Texture>>
                (this,(shared_ptr<pbrt::syntactic::Texture> *)item_00,(string *)auStack_68);
      std::__cxx11::string::~string((string *)(auStack_68 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_68 + 8));
      _Var2._M_pi = extraout_RDX_01;
    }
  }
  else {
    std::__shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2> *)
               (iVar1._M_node + 2));
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pbrt::syntactic::Texture>)
         sVar3.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Item findNamedItem(Item item, std::string name) {
        auto &items = get(Item{});
        auto it = items.find(name);
        if (it != items.end()) return it->second;
        if (parent) return parent->findNamedItem(item,name);
        return nullptr;
      }